

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall QtMWidgets::TableView::setHighlightCellOnClick(TableView *this,bool on)

{
  AbstractScrollAreaPrivate *pAVar1;
  QForeachContainer<QList<QtMWidgets::TableViewSection_*>_> _container_897;
  QForeachContainer<QList<QtMWidgets::TableViewSection_*>_> local_40;
  
  pAVar1 = (this->super_ScrollArea).super_AbstractScrollArea.d.d;
  if ((bool)(char)pAVar1[1].right != on) {
    *(bool *)&pAVar1[1].right = on;
    QtPrivate::QForeachContainer<QList<QtMWidgets::TableViewSection_*>_>::QForeachContainer
              (&local_40,(QList<QtMWidgets::TableViewSection_*> *)&pAVar1[1].viewport);
    for (; local_40.i.i != local_40.e.i; local_40.i.i = local_40.i.i + 1) {
      TableViewSection::setHighlightCellOnClick((TableViewSection *)*local_40.i.i,on);
    }
    QArrayDataPointer<QtMWidgets::TableViewSection_*>::~QArrayDataPointer
              ((QArrayDataPointer<QtMWidgets::TableViewSection_*> *)&local_40);
  }
  return;
}

Assistant:

void
TableView::setHighlightCellOnClick( bool on )
{
	TableViewPrivate * d = d_func();

	if( d->highlightCellOnClick != on )
	{
		d->highlightCellOnClick = on;

		foreach( TableViewSection * sect, d->sections )
			sect->setHighlightCellOnClick( on );
	}
}